

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O2

void __thiscall CVmImageLoader::read_image_header(CVmImageLoader *this)

{
  int iVar1;
  char buf [128];
  
  (*this->fp_->_vptr_CVmImageFile[3])(this->fp_,buf,0x45);
  iVar1 = bcmp(buf,"T3-image\r\n\x1a",0xb);
  if (iVar1 != 0) {
    err_throw(0x130);
  }
  this->ver_ = (uint)(ushort)buf._11_2_;
  *(undefined4 *)this->timestamp_ = buf._45_4_;
  *(undefined4 *)(this->timestamp_ + 4) = buf._49_4_;
  *(undefined4 *)(this->timestamp_ + 8) = buf._53_4_;
  *(undefined4 *)(this->timestamp_ + 0xc) = buf._57_4_;
  *(undefined8 *)(this->timestamp_ + 0x10) = buf._61_8_;
  if ((ushort)buf._11_2_ < 2) {
    return;
  }
  err_throw_a(0x13f,1,8);
}

Assistant:

void CVmImageLoader::read_image_header()
{
    char buf[128];

    /* 
     *   Read the header.  The header consists of the signature string, a
     *   UINT2 with the file format version number, 32 reserved bytes,
     *   then the compilation timestamp (24 bytes).  
     */
    fp_->copy_data(buf, sizeof(VMIMAGE_SIG)-1 + 2 + 32 + 24);

    /* verify the signature */
    if (memcmp(buf, VMIMAGE_SIG, sizeof(VMIMAGE_SIG)-1) != 0)
        err_throw(VMERR_NOT_AN_IMAGE_FILE);

    /* get the version number */
    ver_ = osrp2(buf + sizeof(VMIMAGE_SIG)-1);

    /* store the timestamp */
    memcpy(timestamp_, buf + sizeof(VMIMAGE_SIG)-1 + 2 + 32, 24);

    /* 
     *   Check the version to ensure that it's within the range that this
     *   loader implementation supports.  If not, throw an error, and mark is
     *   as a version-related error.  
     */
    if (ver_ > 1)
        err_throw_a(VMERR_IMAGE_INCOMPAT_VSN, 1, ERR_TYPE_VERSION_FLAG);
}